

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

symbol_id_pair_t * symbol_find(list_t *list,char *name)

{
  symbol_id_pair_t *psVar1;
  int iVar2;
  list_node_t *local_30;
  list_node_t *node;
  symbol_id_pair_t *symbol;
  char *name_local;
  list_t *list_local;
  
  local_30 = list->head;
  while( true ) {
    if (local_30 == (list_node_t *)0x0) {
      return (symbol_id_pair_t *)0x0;
    }
    psVar1 = (symbol_id_pair_t *)local_30->data;
    iVar2 = strcmp(psVar1->name,name);
    if (iVar2 == 0) break;
    local_30 = local_30->next;
  }
  return psVar1;
}

Assistant:

static symbol_id_pair_t*
symbol_find(
    list_t* list,
    char* name
) {
    symbol_id_pair_t* symbol;
    list_for_each(list, symbol) {
        if (strcmp(symbol->name, name) == 0)
            return symbol;
    }
    return NULL;
}